

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,void *originalPtr,size_t originalSize,
          size_t newSize)

{
  ulong uVar1;
  void *newBuffer;
  size_t increment;
  size_t newSize_local;
  size_t originalSize_local;
  void *originalPtr_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_local;
  
  if (originalPtr == (void *)0x0) {
    this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)Malloc(this,newSize);
  }
  else if (newSize == 0) {
    this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  }
  else {
    this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)originalPtr;
    if (originalSize < newSize) {
      if ((originalPtr ==
           (void *)((long)this->chunkHead_ + ((this->chunkHead_->size + 0x18) - originalSize))) &&
         (uVar1 = (newSize - originalSize) + 7 & 0xfffffff8,
         this->chunkHead_->size + uVar1 <= this->chunkHead_->capacity)) {
        this->chunkHead_->size = uVar1 + this->chunkHead_->size;
      }
      else {
        this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)Malloc(this,newSize);
        if (this_local == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
          __assert_fail("newBuffer != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ntrrgc[P]pulse-volume-monitor/vendor/rapidjson/allocators.h"
                        ,0xd5,
                        "void *rapidjson::MemoryPoolAllocator<>::Realloc(void *, size_t, size_t) [BaseAllocator = rapidjson::CrtAllocator]"
                       );
        }
        if (originalSize != 0) {
          memcpy(this_local,originalPtr,originalSize);
        }
      }
    }
  }
  return this_local;
}

Assistant:

void* Realloc(void* originalPtr, size_t originalSize, size_t newSize) {
        if (originalPtr == 0)
            return Malloc(newSize);

        if (newSize == 0)
            return NULL;

        // Do not shrink if new size is smaller than original
        if (originalSize >= newSize)
            return originalPtr;

        // Simply expand it if it is the last allocation and there is sufficient space
        if (originalPtr == (char *)(chunkHead_ + 1) + chunkHead_->size - originalSize) {
            size_t increment = static_cast<size_t>(newSize - originalSize);
            increment = RAPIDJSON_ALIGN(increment);
            if (chunkHead_->size + increment <= chunkHead_->capacity) {
                chunkHead_->size += increment;
                return originalPtr;
            }
        }

        // Realloc process: allocate and copy memory, do not free original buffer.
        void* newBuffer = Malloc(newSize);
        RAPIDJSON_ASSERT(newBuffer != 0);   // Do not handle out-of-memory explicitly.
        if (originalSize)
            std::memcpy(newBuffer, originalPtr, originalSize);
        return newBuffer;
    }